

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O2

bool google::ParseTemplateArgs(State *state)

{
  bool bVar1;
  bool bVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  undefined8 uVar7;
  bool bVar8;
  undefined2 local_4a;
  undefined6 uStack_48;
  undefined2 uStack_42;
  undefined6 uStack_40;
  undefined2 uStack_3a;
  undefined6 uStack_38;
  
  pcVar3 = state->mangled_cur;
  pcVar4 = state->out_cur;
  pcVar5 = state->out_begin;
  pcVar6 = state->out_end;
  uVar7 = *(undefined8 *)((long)&state->prev_name + 6);
  uStack_38 = (undefined6)((ulong)*(undefined8 *)((long)&state->out_end + 6) >> 0x10);
  local_4a = (undefined2)((ulong)pcVar4 >> 0x30);
  uStack_48 = SUB86(pcVar5,0);
  uStack_42 = (undefined2)((ulong)pcVar5 >> 0x30);
  uStack_40 = SUB86(pcVar6,0);
  uStack_3a = (undefined2)((ulong)pcVar6 >> 0x30);
  bVar1 = state->append;
  bVar2 = state->overflowed;
  state->append = false;
  if (*state->mangled_cur == 'I') {
    state->mangled_cur = state->mangled_cur + 1;
    bVar8 = OneOrMore(ParseTemplateArg,state);
    if ((bVar8) && (*state->mangled_cur == 'E')) {
      state->mangled_cur = state->mangled_cur + 1;
      state->append = (bool)(bVar1 & 1);
      MaybeAppend(state,"<>");
      return true;
    }
  }
  *(ulong *)((long)&state->out_cur + 6) = CONCAT62(uStack_48,local_4a);
  *(ulong *)((long)&state->out_begin + 6) = CONCAT62(uStack_40,uStack_42);
  *(ulong *)((long)&state->out_end + 6) = CONCAT62(uStack_38,uStack_3a);
  *(undefined8 *)((long)&state->prev_name + 6) = uVar7;
  state->mangled_cur = pcVar3;
  state->out_cur = pcVar4;
  state->out_begin = pcVar5;
  state->out_end = pcVar6;
  state->append = bVar1;
  state->overflowed = bVar2;
  return false;
}

Assistant:

static bool ParseTemplateArgs(State *state) {
  State copy = *state;
  DisableAppend(state);
  if (ParseOneCharToken(state, 'I') &&
      OneOrMore(ParseTemplateArg, state) &&
      ParseOneCharToken(state, 'E')) {
    RestoreAppend(state, copy.append);
    MaybeAppend(state, "<>");
    return true;
  }
  *state = copy;
  return false;
}